

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

longlong kj::anon_unknown_55::parseSigned(StringPtr *s,longlong min,longlong max)

{
  char *s_00;
  int __base;
  ulong uVar1;
  StringPtr *pSVar2;
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *this;
  bool bVar3;
  Fault f_1;
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  longlong value;
  char *endPtr;
  longlong max_local;
  longlong min_local;
  
  _kjCondition.right = (void *)0x0;
  bVar3 = (s->content).size_ < 2;
  _kjCondition.result = !bVar3;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = s;
  max_local = max;
  min_local = min;
  if (bVar3) {
    this = (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)&endPtr;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              ((Fault *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x2a,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",&_kjCondition,
               (char (*) [37])"String does not contain valid number",s);
  }
  else {
    pSVar2 = (StringPtr *)__errno_location();
    *(int *)&(pSVar2->content).ptr = 0;
    s_00 = (s->content).ptr;
    bVar3 = isHex(s_00);
    __base = 10;
    if (bVar3) {
      __base = 0x10;
    }
    value = strtoll(s_00,&endPtr,__base);
    _kjCondition.right = (s->content).ptr + ((s->content).size_ - 1);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = endPtr == (char *)_kjCondition.right;
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      bVar3 = *(int *)&(pSVar2->content).ptr == 0x22;
      uVar1 = (ulong)_kjCondition.right >> 0x20;
      _kjCondition.right = (void *)CONCAT44((int)uVar1,0x22);
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = !bVar3;
      _kjCondition.left = pSVar2;
      if (bVar3) {
        this = (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)&f_1;
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
                  ((Fault *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x2f,FAILED,"errno != ERANGE","_kjCondition,\"Value out-of-range\", s",
                   (DebugComparison<int_&,_int> *)&_kjCondition,(char (*) [19])"Value out-of-range",
                   s);
      }
      else {
        f_1.exception._0_1_ = value <= max && min <= value;
        if ((bool)f_1.exception._0_1_) {
          return value;
        }
        this = &_kjCondition;
        _::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
                  ((Fault *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x30,FAILED,"value >= min && value <= max",
                   "_kjCondition,\"Value out-of-range\", value, min, max",(bool *)&f_1,
                   (char (*) [19])"Value out-of-range",&value,&min_local,&max_local);
      }
    }
    else {
      this = (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)&f_1;
      _kjCondition.left = (StringPtr *)&endPtr;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[37],kj::StringPtr_const&>
                ((Fault *)this,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x2e,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)&_kjCondition,
                 (char (*) [37])"String does not contain valid number",s);
    }
  }
  _::Debug::Fault::~Fault((Fault *)this);
  return 0;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}